

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObject.cpp
# Opt level: O0

void __thiscall
SessionObject::SessionObject
          (SessionObject *this,SessionObjectStore *inParent,CK_SLOT_ID inSlotID,
          CK_SESSION_HANDLE inHSession,bool inIsPrivate)

{
  MutexFactory *this_00;
  Mutex *pMVar1;
  _func_int **in_RCX;
  _func_int **in_RDX;
  _func_int **in_RSI;
  OSObject *in_RDI;
  byte in_R8B;
  
  OSObject::OSObject(in_RDI);
  in_RDI->_vptr_OSObject = (_func_int **)&PTR__SessionObject_00223bf8;
  std::
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::map((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
         *)0x1e416d);
  in_RDI[10]._vptr_OSObject = in_RCX;
  in_RDI[9]._vptr_OSObject = in_RDX;
  *(byte *)&in_RDI[0xb]._vptr_OSObject = in_R8B & 1;
  this_00 = MutexFactory::i();
  pMVar1 = MutexFactory::getMutex(this_00);
  in_RDI[8]._vptr_OSObject = (_func_int **)pMVar1;
  *(bool *)&in_RDI[7]._vptr_OSObject = in_RDI[8]._vptr_OSObject != (_func_int **)0x0;
  in_RDI[0xc]._vptr_OSObject = in_RSI;
  return;
}

Assistant:

SessionObject::SessionObject(SessionObjectStore* inParent, CK_SLOT_ID inSlotID, CK_SESSION_HANDLE inHSession, bool inIsPrivate)
{
	hSession = inHSession;
	slotID = inSlotID;
	isPrivate = inIsPrivate;
	objectMutex = MutexFactory::i()->getMutex();
	valid = (objectMutex != NULL);
	parent = inParent;
}